

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

void imap_get_message(char *buffer,char **outptr)

{
  size_t sVar1;
  size_t sVar2;
  char *__s;
  
  for (__s = buffer + 2; (*__s == ' ' || (*__s == '\t')); __s = __s + 1) {
  }
  sVar1 = strlen(__s);
  do {
    sVar2 = sVar1;
    if (sVar2 == 0) goto LAB_0051589f;
  } while (((ulong)(byte)__s[sVar2 - 1] < 0x21) &&
          (sVar1 = sVar2 - 1, (0x100002600U >> ((ulong)(byte)__s[sVar2 - 1] & 0x3f) & 1) != 0));
  __s[sVar2] = '\0';
LAB_0051589f:
  *outptr = __s;
  return;
}

Assistant:

static void imap_get_message(char *buffer, char** outptr)
{
  size_t len = 0;
  char* message = NULL;

  /* Find the start of the message */
  for(message = buffer + 2; *message == ' ' || *message == '\t'; message++)
    ;

  /* Find the end of the message */
  for(len = strlen(message); len--;)
    if(message[len] != '\r' && message[len] != '\n' && message[len] != ' ' &&
        message[len] != '\t')
      break;

  /* Terminate the message */
  if(++len) {
    message[len] = '\0';
  }

  *outptr = message;
}